

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O3

void __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::
swap_l<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::double_storage>
          (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
           *this,basic_json<char,_jsoncons::order_preserving_policy,_std::pmr::polymorphic_allocator<char>_>
                 *other)

{
  bool_storage bVar1;
  byte bVar2;
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>> bVar3;
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>> bVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  pointer phVar7;
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>> bVar8;
  common_storage cVar9;
  pointer phVar10;
  void *__src;
  ulong uVar11;
  bool_storage temp;
  undefined1 auStack_26e [14];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_260;
  undefined1 auStack_22e [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_218;
  undefined1 auStack_1e6 [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_1d0;
  undefined1 auStack_19e [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_188;
  undefined1 auStack_156 [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_140;
  undefined1 auStack_10e [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_f8;
  undefined1 auStack_c6 [22];
  basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
  *pbStack_b0;
  undefined1 auStack_46 [22];
  
  bVar1 = (other->field_0).boolean_;
  switch((byte)bVar1 & 0xf) {
  case 0:
  case 4:
    cVar9 = (other->field_0).common_;
    phVar10 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar10;
    goto LAB_0079286f;
  case 1:
    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).short_str_.data_[0];
    cVar9 = (other->field_0).common_;
    phVar10 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar10;
    this[2] = bVar8;
LAB_0079286f:
    *(common_storage *)this = cVar9;
    return;
  default:
    uVar6 = *(undefined8 *)&other->field_0;
    phVar10 = (other->field_0).long_str_.ptr_;
    phVar7 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar7;
    *(undefined8 *)this = uVar6;
    *(pointer *)(this + 8) = phVar10;
    return;
  case 6:
    uVar5 = *(undefined4 *)&other->field_0;
    phVar10 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar10;
    *(undefined4 *)this = uVar5;
    return;
  case 7:
    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).common_.tag_;
    uVar11 = (ulong)((byte)bVar1 >> 4);
    memcpy(auStack_46,(void *)((long)&other->field_0 + 2),uVar11);
    auStack_46[uVar11] = 0;
    phVar10 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar10;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )bVar1;
    this[1] = bVar8;
    memcpy(this + 2,auStack_46,uVar11);
    this[uVar11 + 2] =
         (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>)
         0x0;
    return;
  case 10:
  case 0xb:
    bVar2 = *(byte *)&other->field_0;
    switch(bVar2 & 0xf) {
    case 0:
    case 4:
      cVar9 = (other->field_0).common_;
      bVar8 = *this;
      (other->field_0).boolean_ = (bool_storage)(cVar9._0_1_ & 0xf0 | (byte)bVar8 & 0xf);
      bVar3 = *this;
      (other->field_0).boolean_ = (bool_storage)((byte)bVar3 & 0xf0 | (byte)bVar8 & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
      *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar3 >> 4) + 2) = 0;
      *(common_storage *)this = cVar9;
      break;
    case 1:
      bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
               )(other->field_0).short_str_.data_[0];
      cVar9 = (other->field_0).common_;
      bVar3 = *this;
      (other->field_0).boolean_ = (bool_storage)(bVar2 & 0xf0 | (byte)bVar3 & 0xf);
      bVar4 = *this;
      (other->field_0).boolean_ = (bool_storage)((byte)bVar4 & 0xf0 | (byte)bVar3 & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
      *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar4 >> 4) + 2) = 0;
      *(common_storage *)this = cVar9;
      this[2] = bVar8;
      break;
    default:
      uVar6 = *(undefined8 *)&other->field_0;
      phVar10 = (other->field_0).long_str_.ptr_;
      bVar8 = *this;
      (other->field_0).boolean_ = (bool_storage)(bVar2 & 0xf0 | (byte)bVar8 & 0xf);
      bVar3 = *this;
      (other->field_0).boolean_ = (bool_storage)((byte)bVar3 & 0xf0 | (byte)bVar8 & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
      *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar3 >> 4) + 2) = 0;
      *(undefined8 *)this = uVar6;
      *(pointer *)(this + 8) = phVar10;
      break;
    case 6:
      uVar5 = *(undefined4 *)&other->field_0;
      bVar8 = *this;
      (other->field_0).boolean_ = (bool_storage)((byte)uVar5 & 0xf0 | (byte)bVar8 & 0xf);
      bVar3 = *this;
      (other->field_0).boolean_ = (bool_storage)((byte)bVar3 & 0xf0 | (byte)bVar8 & 0xf);
      (other->field_0).common_.tag_ = (semantic_tag)this[1];
      memcpy((void *)((long)&other->field_0 + 2),this + 2,(ulong)((byte)*this >> 4));
      *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar3 >> 4) + 2) = 0;
      *(undefined4 *)this = uVar5;
      break;
    case 7:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage>
                (this,other);
      return;
    case 10:
    case 0xb:
      bVar1 = (other->field_0).boolean_;
      pbStack_b0 = this;
      switch((byte)bVar1 & 0xf) {
      case 0:
      case 4:
        cVar9 = (other->field_0).common_;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        goto LAB_00792bf6;
      case 1:
        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).short_str_.data_[0];
        cVar9 = (other->field_0).common_;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        this[2] = bVar8;
LAB_00792bf6:
        *(common_storage *)this = cVar9;
        return;
      default:
        uVar6 = *(undefined8 *)&other->field_0;
        phVar10 = (other->field_0).long_str_.ptr_;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        *(undefined8 *)this = uVar6;
        *(pointer *)(this + 8) = phVar10;
        return;
      case 6:
        uVar5 = *(undefined4 *)&other->field_0;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        *(undefined4 *)this = uVar5;
        return;
      case 7:
        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).common_.tag_;
        uVar11 = (ulong)((byte)bVar1 >> 4);
        memcpy(auStack_c6,(void *)((long)&other->field_0 + 2),uVar11);
        auStack_c6[uVar11] = 0;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )bVar1;
        this[1] = bVar8;
        memcpy(this + 2,auStack_c6,uVar11);
        this[uVar11 + 2] =
             (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
              )0x0;
        return;
      case 10:
      case 0xb:
        bVar1 = (other->field_0).boolean_;
        pbStack_f8 = this;
        switch((byte)bVar1 & 0xf) {
        case 0:
        case 4:
          cVar9 = (other->field_0).common_;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          goto LAB_00792dc4;
        case 1:
          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).short_str_.data_[0];
          cVar9 = (other->field_0).common_;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          this[2] = bVar8;
LAB_00792dc4:
          *(common_storage *)this = cVar9;
          return;
        default:
          uVar6 = *(undefined8 *)&other->field_0;
          phVar10 = (other->field_0).long_str_.ptr_;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          *(undefined8 *)this = uVar6;
          *(pointer *)(this + 8) = phVar10;
          return;
        case 6:
          uVar5 = *(undefined4 *)&other->field_0;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          *(undefined4 *)this = uVar5;
          return;
        case 7:
          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).common_.tag_;
          uVar11 = (ulong)((byte)bVar1 >> 4);
          memcpy(auStack_10e,(void *)((long)&other->field_0 + 2),uVar11);
          auStack_10e[uVar11] = 0;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )bVar1;
          this[1] = bVar8;
          memcpy(this + 2,auStack_10e,uVar11);
          this[uVar11 + 2] =
               (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                )0x0;
          return;
        case 10:
        case 0xb:
          bVar1 = (other->field_0).boolean_;
          pbStack_140 = this;
          switch((byte)bVar1 & 0xf) {
          case 0:
          case 4:
            cVar9 = (other->field_0).common_;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            goto LAB_00792f96;
          case 1:
            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )(other->field_0).short_str_.data_[0];
            cVar9 = (other->field_0).common_;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            this[2] = bVar8;
LAB_00792f96:
            *(common_storage *)this = cVar9;
            return;
          default:
            uVar6 = *(undefined8 *)&other->field_0;
            phVar10 = (other->field_0).long_str_.ptr_;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            *(undefined8 *)this = uVar6;
            *(pointer *)(this + 8) = phVar10;
            return;
          case 6:
            uVar5 = *(undefined4 *)&other->field_0;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            *(undefined4 *)this = uVar5;
            return;
          case 7:
            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )(other->field_0).common_.tag_;
            uVar11 = (ulong)((byte)bVar1 >> 4);
            memcpy(auStack_156,(void *)((long)&other->field_0 + 2),uVar11);
            auStack_156[uVar11] = 0;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )bVar1;
            this[1] = bVar8;
            memcpy(this + 2,auStack_156,uVar11);
            this[uVar11 + 2] =
                 (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                  )0x0;
            return;
          case 10:
          case 0xb:
            bVar1 = (other->field_0).boolean_;
            pbStack_188 = this;
            switch((byte)bVar1 & 0xf) {
            case 0:
            case 4:
              cVar9 = (other->field_0).common_;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              goto LAB_00793168;
            case 1:
              bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )(other->field_0).short_str_.data_[0];
              cVar9 = (other->field_0).common_;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              this[2] = bVar8;
LAB_00793168:
              *(common_storage *)this = cVar9;
              return;
            default:
              uVar6 = *(undefined8 *)&other->field_0;
              phVar10 = (other->field_0).long_str_.ptr_;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              *(undefined8 *)this = uVar6;
              *(pointer *)(this + 8) = phVar10;
              return;
            case 6:
              uVar5 = *(undefined4 *)&other->field_0;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              *(undefined4 *)this = uVar5;
              return;
            case 7:
              bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )(other->field_0).common_.tag_;
              uVar11 = (ulong)((byte)bVar1 >> 4);
              memcpy(auStack_19e,(void *)((long)&other->field_0 + 2),uVar11);
              auStack_19e[uVar11] = 0;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )bVar1;
              this[1] = bVar8;
              memcpy(this + 2,auStack_19e,uVar11);
              this[uVar11 + 2] =
                   (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                    )0x0;
              return;
            case 10:
            case 0xb:
              bVar1 = (other->field_0).boolean_;
              pbStack_1d0 = this;
              switch((byte)bVar1 & 0xf) {
              case 0:
              case 4:
                cVar9 = (other->field_0).common_;
                phVar10 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar10;
                goto LAB_007932b7;
              case 1:
                bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )(other->field_0).short_str_.data_[0];
                cVar9 = (other->field_0).common_;
                phVar10 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar10;
                this[2] = bVar8;
LAB_007932b7:
                *(common_storage *)this = cVar9;
                return;
              default:
                uVar6 = *(undefined8 *)&other->field_0;
                phVar10 = (other->field_0).long_str_.ptr_;
                phVar7 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar7;
                *(undefined8 *)this = uVar6;
                *(pointer *)(this + 8) = phVar10;
                return;
              case 6:
                uVar5 = *(undefined4 *)&other->field_0;
                phVar10 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar10;
                *(undefined4 *)this = uVar5;
                return;
              case 7:
                bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )(other->field_0).common_.tag_;
                uVar11 = (ulong)((byte)bVar1 >> 4);
                memcpy(auStack_1e6,(void *)((long)&other->field_0 + 2),uVar11);
                auStack_1e6[uVar11] = 0;
                phVar10 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar10;
                *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )bVar1;
                this[1] = bVar8;
                memcpy(this + 2,auStack_1e6,uVar11);
                this[uVar11 + 2] =
                     (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                      )0x0;
                return;
              case 10:
              case 0xb:
                bVar1 = (other->field_0).boolean_;
                pbStack_218 = this;
                switch((byte)bVar1 & 0xf) {
                case 0:
                case 4:
                  cVar9 = (other->field_0).common_;
                  phVar10 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar10;
                  goto LAB_007933f7;
                case 1:
                  bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )(other->field_0).short_str_.data_[0];
                  cVar9 = (other->field_0).common_;
                  phVar10 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar10;
                  this[2] = bVar8;
LAB_007933f7:
                  *(common_storage *)this = cVar9;
                  return;
                default:
                  uVar6 = *(undefined8 *)&other->field_0;
                  phVar10 = (other->field_0).long_str_.ptr_;
                  phVar7 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar7;
                  *(undefined8 *)this = uVar6;
                  *(pointer *)(this + 8) = phVar10;
                  return;
                case 6:
                  uVar5 = *(undefined4 *)&other->field_0;
                  phVar10 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar10;
                  *(undefined4 *)this = uVar5;
                  return;
                case 7:
                  bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )(other->field_0).common_.tag_;
                  uVar11 = (ulong)((byte)bVar1 >> 4);
                  memcpy(auStack_22e,(void *)((long)&other->field_0 + 2),uVar11);
                  auStack_22e[uVar11] = 0;
                  phVar10 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar10;
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )bVar1;
                  this[1] = bVar8;
                  memcpy(this + 2,auStack_22e,uVar11);
                  this[uVar11 + 2] =
                       (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                        )0x0;
                  return;
                case 10:
                case 0xb:
                  bVar1 = (other->field_0).boolean_;
                  bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )(other->field_0).common_.tag_;
                  __src = (void *)((long)&other->field_0 + 2);
                  uVar11 = (ulong)((byte)bVar1 >> 4);
                  pbStack_260 = this;
                  memcpy(auStack_26e,__src,uVar11);
                  auStack_26e[uVar11] = 0;
                  bVar3 = *this;
                  (other->field_0).boolean_ = (bool_storage)((byte)bVar1 & 0xf0 | (byte)bVar3 & 0xf)
                  ;
                  bVar4 = *this;
                  (other->field_0).boolean_ = (bool_storage)((byte)bVar4 & 0xf0 | (byte)bVar3 & 0xf)
                  ;
                  (other->field_0).common_.tag_ = (semantic_tag)this[1];
                  memcpy(__src,this + 2,(ulong)((byte)*this >> 4));
                  *(undefined1 *)((long)&other->field_0 + (ulong)((byte)bVar4 >> 4) + 2) = 0;
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )bVar1;
                  this[1] = bVar8;
                  memcpy(this + 2,auStack_26e,uVar11);
                  this[uVar11 + 2] =
                       (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                        )0x0;
                  return;
                case 0xc:
                  bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )(other->field_0).common_.tag_;
                  phVar10 = (other->field_0).long_str_.ptr_;
                  phVar7 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar7;
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )0xc;
                  break;
                case 0xd:
                  bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )(other->field_0).common_.tag_;
                  phVar10 = (other->field_0).long_str_.ptr_;
                  phVar7 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar7;
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )0xd;
                  break;
                case 0xe:
                  bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )(other->field_0).common_.tag_;
                  phVar10 = (other->field_0).long_str_.ptr_;
                  phVar7 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar7;
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )0xe;
                  break;
                case 0xf:
                  bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )(other->field_0).common_.tag_;
                  phVar10 = (other->field_0).long_str_.ptr_;
                  phVar7 = *(pointer *)(this + 8);
                  *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                  (other->field_0).long_str_.ptr_ = phVar7;
                  *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                           )0xf;
                }
                this[1] = bVar8;
                *(pointer *)(this + 8) = phVar10;
                return;
              case 0xc:
                bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )(other->field_0).common_.tag_;
                phVar10 = (other->field_0).long_str_.ptr_;
                phVar7 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar7;
                *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )0xc;
                break;
              case 0xd:
                bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )(other->field_0).common_.tag_;
                phVar10 = (other->field_0).long_str_.ptr_;
                phVar7 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar7;
                *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )0xd;
                break;
              case 0xe:
                bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )(other->field_0).common_.tag_;
                phVar10 = (other->field_0).long_str_.ptr_;
                phVar7 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar7;
                *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )0xe;
                break;
              case 0xf:
                bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )(other->field_0).common_.tag_;
                phVar10 = (other->field_0).long_str_.ptr_;
                phVar7 = *(pointer *)(this + 8);
                *(undefined8 *)&other->field_0 = *(undefined8 *)this;
                (other->field_0).long_str_.ptr_ = phVar7;
                *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                         )0xf;
              }
              this[1] = bVar8;
              *(pointer *)(this + 8) = phVar10;
              return;
            case 0xc:
              bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )(other->field_0).common_.tag_;
              phVar10 = (other->field_0).long_str_.ptr_;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )0xc;
              break;
            case 0xd:
              bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )(other->field_0).common_.tag_;
              phVar10 = (other->field_0).long_str_.ptr_;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )0xd;
              break;
            case 0xe:
              bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )(other->field_0).common_.tag_;
              phVar10 = (other->field_0).long_str_.ptr_;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )0xe;
              break;
            case 0xf:
              bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )(other->field_0).common_.tag_;
              phVar10 = (other->field_0).long_str_.ptr_;
              (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
              (other->field_0).common_.tag_ = (semantic_tag)this[1];
              (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
              *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                       )0xf;
            }
            this[1] = bVar8;
            *(pointer *)(this + 8) = phVar10;
            return;
          case 0xc:
            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )(other->field_0).common_.tag_;
            phVar10 = (other->field_0).long_str_.ptr_;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )0xc;
            break;
          case 0xd:
            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )(other->field_0).common_.tag_;
            phVar10 = (other->field_0).long_str_.ptr_;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )0xd;
            break;
          case 0xe:
            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )(other->field_0).common_.tag_;
            phVar10 = (other->field_0).long_str_.ptr_;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )0xe;
            break;
          case 0xf:
            bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )(other->field_0).common_.tag_;
            phVar10 = (other->field_0).long_str_.ptr_;
            (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
            (other->field_0).common_.tag_ = (semantic_tag)this[1];
            (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
            *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                     )0xf;
          }
          this[1] = bVar8;
          *(pointer *)(this + 8) = phVar10;
          return;
        case 0xc:
          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).common_.tag_;
          phVar10 = (other->field_0).long_str_.ptr_;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )0xc;
          break;
        case 0xd:
          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).common_.tag_;
          phVar10 = (other->field_0).long_str_.ptr_;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )0xd;
          break;
        case 0xe:
          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).common_.tag_;
          phVar10 = (other->field_0).long_str_.ptr_;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )0xe;
          break;
        case 0xf:
          bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )(other->field_0).common_.tag_;
          phVar10 = (other->field_0).long_str_.ptr_;
          (other->field_0).boolean_ = (bool_storage)((byte)*this & 0xf);
          (other->field_0).common_.tag_ = (semantic_tag)this[1];
          (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
          *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                   )0xf;
        }
        this[1] = bVar8;
        *(pointer *)(this + 8) = phVar10;
        return;
      case 0xc:
        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).common_.tag_;
        phVar10 = (other->field_0).long_str_.ptr_;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )0xc;
        break;
      case 0xd:
        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).common_.tag_;
        phVar10 = (other->field_0).long_str_.ptr_;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )0xd;
        break;
      case 0xe:
        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).common_.tag_;
        phVar10 = (other->field_0).long_str_.ptr_;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )0xe;
        break;
      case 0xf:
        bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )(other->field_0).common_.tag_;
        phVar10 = (other->field_0).long_str_.ptr_;
        (other->field_0).boolean_ = (bool_storage)0xf;
        (other->field_0).common_.tag_ = (semantic_tag)this[1];
        (other->field_0).long_str_.ptr_ = *(pointer *)(this + 8);
        *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
                 )0xf;
      }
      this[1] = bVar8;
      *(pointer *)(this + 8) = phVar10;
      return;
    case 0xc:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::byte_string_storage>
                (this,other);
      return;
    case 0xd:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::object_storage>
                (this,other);
      return;
    case 0xe:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::array_storage>
                (this,other);
      return;
    case 0xf:
      swap_l_r<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::short_string_storage,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>::long_string_storage>
                (this,other);
      return;
    }
    return;
  case 0xc:
    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).common_.tag_;
    phVar10 = (other->field_0).long_str_.ptr_;
    phVar7 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar7;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )0xc;
    break;
  case 0xd:
    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).common_.tag_;
    phVar10 = (other->field_0).long_str_.ptr_;
    phVar7 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar7;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )0xd;
    break;
  case 0xe:
    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).common_.tag_;
    phVar10 = (other->field_0).long_str_.ptr_;
    phVar7 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar7;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )0xe;
    break;
  case 0xf:
    bVar8 = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )(other->field_0).common_.tag_;
    phVar10 = (other->field_0).long_str_.ptr_;
    phVar7 = *(pointer *)(this + 8);
    *(undefined8 *)&other->field_0 = *(undefined8 *)this;
    (other->field_0).long_str_.ptr_ = phVar7;
    *this = (basic_json<char,jsoncons::order_preserving_policy,std::pmr::polymorphic_allocator<char>>
             )0xf;
  }
  this[1] = bVar8;
  *(pointer *)(this + 8) = phVar10;
  return;
}

Assistant:

void swap_l(basic_json& other) noexcept
        {
            switch (other.storage_kind())
            {
                case json_storage_kind::null         : swap_l_r<TypeL, null_storage>(other); break;
                case json_storage_kind::empty_object : swap_l_r<TypeL, empty_object_storage>(other); break;
                case json_storage_kind::boolean         : swap_l_r<TypeL, bool_storage>(other); break;
                case json_storage_kind::int64        : swap_l_r<TypeL, int64_storage>(other); break;
                case json_storage_kind::uint64       : swap_l_r<TypeL, uint64_storage>(other); break;
                case json_storage_kind::half_float         : swap_l_r<TypeL, half_storage>(other); break;
                case json_storage_kind::float64       : swap_l_r<TypeL, double_storage>(other); break;
                case json_storage_kind::short_str : swap_l_r<TypeL, short_string_storage>(other); break;
                case json_storage_kind::long_str  : swap_l_r<TypeL, long_string_storage>(other); break;
                case json_storage_kind::byte_str  : swap_l_r<TypeL, byte_string_storage>(other); break;
                case json_storage_kind::array        : swap_l_r<TypeL, array_storage>(other); break;
                case json_storage_kind::object       : swap_l_r<TypeL, object_storage>(other); break;
                case json_storage_kind::json_const_reference : swap_l_r<TypeL, json_const_reference_storage>(other); break;
                case json_storage_kind::json_reference : swap_l_r<TypeL, json_reference_storage>(other); break;
                default:
                    JSONCONS_UNREACHABLE();
                    break;
            }
        }